

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digraph.h
# Opt level: O2

CDAG * degreeOrdered(CDAG *__return_storage_ptr__,CGraph *g)

{
  long lVar1;
  long lVar2;
  EdgeIdx *pEVar3;
  long lVar4;
  long lVar5;
  EdgeIdx *pEVar6;
  VertexIdx *pVVar7;
  EdgeIdx *pEVar8;
  VertexIdx *pVVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  
  lVar2 = g->nVertices;
  lVar13 = 0;
  uVar17 = -(ulong)(lVar2 + 1U >> 0x3d != 0) | lVar2 * 8 + 8U;
  pEVar6 = (EdgeIdx *)operator_new__(uVar17);
  uVar14 = -(ulong)(g->nEdges + 1U >> 0x3d != 0) | g->nEdges * 8 + 8U;
  pVVar7 = (VertexIdx *)operator_new__(uVar14);
  pEVar8 = (EdgeIdx *)operator_new__(uVar17);
  pVVar9 = (VertexIdx *)operator_new__(uVar14);
  *pEVar6 = 0;
  *pEVar8 = 0;
  lVar10 = 0;
  if (0 < lVar2) {
    lVar10 = lVar2;
  }
  lVar11 = 0;
  lVar18 = 0;
  lVar19 = 0;
  lVar12 = 0;
  while (lVar12 != lVar10) {
    pEVar3 = g->offsets;
    lVar15 = pEVar3[lVar12];
    lVar4 = pEVar3[lVar12 + 1];
    lVar1 = lVar12 + 1;
    lVar16 = lVar4 - lVar15;
    for (; lVar15 < lVar4; lVar15 = lVar15 + 1) {
      lVar5 = g->nbors[lVar15];
      if ((lVar16 < pEVar3[lVar5 + 1] - pEVar3[lVar5]) ||
         ((lVar12 < lVar5 && (lVar16 == pEVar3[lVar5 + 1] - pEVar3[lVar5])))) {
        pVVar7[lVar11] = lVar5;
        lVar11 = lVar11 + 1;
        lVar19 = lVar19 + 1;
      }
      else {
        pVVar9[lVar13] = lVar5;
        lVar13 = lVar13 + 1;
        lVar18 = lVar18 + 1;
      }
    }
    pEVar6[lVar1] = lVar11;
    pEVar8[lVar1] = lVar13;
    lVar12 = lVar1;
  }
  lVar10 = lVar2;
  for (lVar13 = 0; lVar13 < lVar10; lVar13 = lVar13 + 1) {
    std::__sort<long*,__gnu_cxx::__ops::_Iter_comp_iter<DegreeComp>>
              (pVVar7 + pEVar6[lVar13],pVVar7 + pEVar6[lVar13 + 1],(_Iter_comp_iter<DegreeComp>)g);
    lVar10 = g->nVertices;
  }
  (__return_storage_ptr__->outlist).nVertices = lVar2;
  (__return_storage_ptr__->outlist).nEdges = lVar19;
  (__return_storage_ptr__->outlist).offsets = pEVar6;
  (__return_storage_ptr__->outlist).nbors = pVVar7;
  (__return_storage_ptr__->inlist).nVertices = lVar2;
  (__return_storage_ptr__->inlist).nEdges = lVar18;
  (__return_storage_ptr__->inlist).offsets = pEVar8;
  (__return_storage_ptr__->inlist).nbors = pVVar9;
  return __return_storage_ptr__;
}

Assistant:

CDAG degreeOrdered(CGraph *g) {
    CDAG ret;     // CDAG to be returned
    CGraph outdag = {g->nVertices, 0, new EdgeIdx[g->nVertices + 1],
                     new VertexIdx[g->nEdges + 1]};  // Initialize DAG of out-edges
    CGraph indag = {g->nVertices, 0, new EdgeIdx[g->nVertices + 1],
                    new VertexIdx[g->nEdges + 1]};   // Initialize DAG of in-edges
    EdgeIdx outcur = 0;
    EdgeIdx incur = 0;
    VertexIdx dest;
    VertexIdx degi;
    VertexIdx degdest;

    outdag.offsets[0] = 0;
    indag.offsets[0] = 0;
    for (VertexIdx i = 0; i < g->nVertices; ++i)   // Looping over all vertices in g
    {
        for (EdgeIdx j = g->offsets[i]; j < g->offsets[i + 1]; ++j)   // Looping over neighbors of i in g
        {
            dest = g->nbors[j];     // We are now looking at edge (i,dest)
            degi = g->offsets[i + 1] - g->offsets[i];   // Degree of i
            degdest = g->offsets[dest + 1] - g->offsets[dest];   // Degree of dest
            //printf("i=%lld dest=%lld degi=%lld degdest=%lld\n",i,dest,degi,degdest);

            //We now orient the edge depending of degi vs degdest.
            // We break ties according to vertex id.
            // In the output, the g-edge (i,dest) is either pointing to dest (in if condition) or pointing to i (in else condition).

            if (degi < degdest || (degi == degdest && i < dest)) {
                outdag.nbors[outcur] = dest;   // We want point edge from i to dest. So this directed edge is added to outdag.
                ++outcur;                      // Increment pointer in outdag.nbors and the number of edges in outdag.
                ++outdag.nEdges;
            } else {
                indag.nbors[incur] = dest;     // We point edge from dest to i. So this edge goes into indag.
                ++incur;                       // Pointer and number of edges incremented
                ++indag.nEdges;
            }
        }
        outdag.offsets[i +
                       1] = outcur;         // We have finished all edges incident to i, so we can update offsets in DAGs.
        indag.offsets[i + 1] = incur;
    }

    for (VertexIdx i = 0; i < g->nVertices; ++i)  // Loops over vertices
        std::sort(outdag.nbors + outdag.offsets[i], outdag.nbors + outdag.offsets[i + 1], DegreeComp(
                g)); // In outdag, sort all neighbors of i according to their degree. Note that DegreeComp gives the desired comparator.

    ret.outlist = outdag;
    ret.inlist = indag;

    return ret;
}